

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

ClientRequest * __thiscall
cmFileAPI::BuildClientRequest(ClientRequest *__return_storage_ptr__,cmFileAPI *this,Value *request)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_c8 [8];
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> versions;
  Value *version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string *kindName;
  Value *kind;
  byte local_21;
  Value *local_20;
  Value *request_local;
  cmFileAPI *this_local;
  ClientRequest *r;
  
  local_21 = 0;
  local_20 = request;
  request_local = (Value *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  ClientRequest::ClientRequest(__return_storage_ptr__);
  bVar2 = Json::Value::isObject(local_20);
  if (!bVar2) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Error,"request is not an object");
    local_21 = 1;
    kind._0_4_ = 1;
    goto LAB_003c6c26;
  }
  kindName = (string *)Json::Value::operator[](local_20,"kind");
  bVar2 = Json::Value::isNull((Value *)kindName);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Error,"\'kind\' member missing");
    local_21 = 1;
    kind._0_4_ = 1;
    goto LAB_003c6c26;
  }
  bVar2 = Json::Value::isString((Value *)kindName);
  if (!bVar2) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Error,"\'kind\' member is not a string");
    local_21 = 1;
    kind._0_4_ = 1;
    goto LAB_003c6c26;
  }
  Json::Value::asString_abi_cxx11_(&local_68,(Value *)kindName);
  local_48 = &local_68;
  pcVar3 = ObjectKindName(CodeModel);
  bVar2 = std::operator==(&local_68,pcVar3);
  pbVar1 = local_48;
  if (bVar2) {
    (__return_storage_ptr__->super_Object).Kind = CodeModel;
LAB_003c6a6e:
    versions.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Json::Value::operator[](local_20,"version");
    bVar2 = Json::Value::isNull((Value *)versions.
                                         super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->Error,"\'version\' member missing");
      local_21 = 1;
      kind._0_4_ = 1;
    }
    else {
      std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::vector
                ((vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *)
                 local_c8);
      bVar2 = ReadRequestVersions((Value *)versions.
                                           super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                                   *)local_c8,&__return_storage_ptr__->Error);
      if (bVar2) {
        switch((__return_storage_ptr__->super_Object).Kind) {
        case CodeModel:
          BuildClientRequestCodeModel
                    (this,__return_storage_ptr__,
                     (vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      *)local_c8);
          break;
        case Cache:
          BuildClientRequestCache
                    (this,__return_storage_ptr__,
                     (vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      *)local_c8);
          break;
        case CMakeFiles:
          BuildClientRequestCMakeFiles
                    (this,__return_storage_ptr__,
                     (vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      *)local_c8);
          break;
        case InternalTest:
          BuildClientRequestInternalTest
                    (this,__return_storage_ptr__,
                     (vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      *)local_c8);
        }
      }
      local_21 = 1;
      kind._0_4_ = 1;
      std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::~vector
                ((vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *)
                 local_c8);
    }
  }
  else {
    pcVar3 = ObjectKindName(Cache);
    bVar2 = std::operator==(pbVar1,pcVar3);
    pbVar1 = local_48;
    if (bVar2) {
      (__return_storage_ptr__->super_Object).Kind = Cache;
      goto LAB_003c6a6e;
    }
    pcVar3 = ObjectKindName(CMakeFiles);
    bVar2 = std::operator==(pbVar1,pcVar3);
    pbVar1 = local_48;
    if (bVar2) {
      (__return_storage_ptr__->super_Object).Kind = CMakeFiles;
      goto LAB_003c6a6e;
    }
    pcVar3 = ObjectKindName(InternalTest);
    bVar2 = std::operator==(pbVar1,pcVar3);
    if (bVar2) {
      (__return_storage_ptr__->super_Object).Kind = InternalTest;
      goto LAB_003c6a6e;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&version,
                   "unknown request kind \'",local_48);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&version,
                   "\'");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Error,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&version);
    local_21 = 1;
    kind._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_003c6c26:
  if ((local_21 & 1) == 0) {
    ClientRequest::~ClientRequest(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequest cmFileAPI::BuildClientRequest(
  Json::Value const& request)
{
  ClientRequest r;

  if (!request.isObject()) {
    r.Error = "request is not an object";
    return r;
  }

  Json::Value const& kind = request["kind"];
  if (kind.isNull()) {
    r.Error = "'kind' member missing";
    return r;
  }
  if (!kind.isString()) {
    r.Error = "'kind' member is not a string";
    return r;
  }
  std::string const& kindName = kind.asString();

  if (kindName == this->ObjectKindName(ObjectKind::CodeModel)) {
    r.Kind = ObjectKind::CodeModel;
  } else if (kindName == this->ObjectKindName(ObjectKind::Cache)) {
    r.Kind = ObjectKind::Cache;
  } else if (kindName == this->ObjectKindName(ObjectKind::CMakeFiles)) {
    r.Kind = ObjectKind::CMakeFiles;
  } else if (kindName == this->ObjectKindName(ObjectKind::InternalTest)) {
    r.Kind = ObjectKind::InternalTest;
  } else {
    r.Error = "unknown request kind '" + kindName + "'";
    return r;
  }

  Json::Value const& version = request["version"];
  if (version.isNull()) {
    r.Error = "'version' member missing";
    return r;
  }
  std::vector<RequestVersion> versions;
  if (!cmFileAPI::ReadRequestVersions(version, versions, r.Error)) {
    return r;
  }

  switch (r.Kind) {
    case ObjectKind::CodeModel:
      this->BuildClientRequestCodeModel(r, versions);
      break;
    case ObjectKind::Cache:
      this->BuildClientRequestCache(r, versions);
      break;
    case ObjectKind::CMakeFiles:
      this->BuildClientRequestCMakeFiles(r, versions);
      break;
    case ObjectKind::InternalTest:
      this->BuildClientRequestInternalTest(r, versions);
      break;
  }

  return r;
}